

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix_sparse_new.cpp
# Opt level: O3

void __thiscall
matrix_sparse_row_test_empty_row_Test::TestBody(matrix_sparse_row_test_empty_row_Test *this)

{
  long *plVar1;
  pointer piVar2;
  pointer_index piVar3;
  bool bVar4;
  char cVar5;
  int iVar6;
  char *pcVar7;
  StringLike<const_char_*> *regex;
  long *plVar8;
  size_t sVar9;
  long lVar10;
  pointer pdVar11;
  DeathTest *gtest_dt;
  AssertionResult gtest_ar;
  Matrix_Sparse_Row<double,_int> row;
  Base_Iterator_Matrix_Sparse_Element<double,_int,_false> local_c0;
  Base_Iterator_Matrix_Sparse_Element<double,_int,_false> local_b0;
  Message local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_98 [3];
  CSR_Data<double,_int> *local_80;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_78;
  Matrix_Sparse_Row<double,_int> local_60;
  
  local_80 = &(this->super_matrix_sparse_row_test).csr_data;
  piVar2 = (this->super_matrix_sparse_row_test).csr_data.row_offset.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  lVar10 = (long)piVar2[1];
  plVar8 = (long *)((this->super_matrix_sparse_row_test).csr_data.i_column.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start + lVar10);
  sVar9 = piVar2[2] - lVar10;
  pdVar11 = (this->super_matrix_sparse_row_test).csr_data.value.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start + lVar10;
  local_b0.ptr_column = (pointer_index)CONCAT44(local_b0.ptr_column._4_4_,piVar2[2]);
  local_c0.ptr_column = (pointer_index)CONCAT44(local_c0.ptr_column._4_4_,2);
  local_60.ptr_data = local_80;
  local_60.iter_row_offset._M_current = piVar2 + 1;
  local_60.i_column._M_ptr = (pointer)plVar8;
  local_60.i_column._M_extent._M_extent_value = sVar9;
  local_60.value._M_ptr = pdVar11;
  local_60.value._M_extent._M_extent_value = sVar9;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_a0,"row.row_offset()","2",(int *)&local_b0,(int *)&local_c0);
  if (local_a0.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_b0);
    if (local_98[0] == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = (local_98[0]->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse_new.cpp"
               ,0x152,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c0,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c0);
    if ((long *)local_b0.ptr_column != (long *)0x0) {
      (**(code **)(*(long *)local_b0.ptr_column + 8))();
    }
  }
  if (local_98[0] != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_98,local_98[0]);
  }
  local_b0.ptr_column = (pointer_index)CONCAT44(local_b0.ptr_column._4_4_,piVar2[2] - piVar2[1]);
  local_c0.ptr_column = (pointer_index)((ulong)local_c0.ptr_column & 0xffffffff00000000);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_a0,"row.size_non_zero()","0",(int *)&local_b0,(int *)&local_c0);
  if (local_a0.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_b0);
    if (local_98[0] == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = (local_98[0]->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse_new.cpp"
               ,0x153,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c0,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c0);
    if ((long *)local_b0.ptr_column != (long *)0x0) {
      (**(code **)(*(long *)local_b0.ptr_column + 8))();
    }
  }
  if (local_98[0] != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_98,local_98[0]);
  }
  local_b0.ptr_column =
       (pointer_index)
       CONCAT44(local_b0.ptr_column._4_4_,
                (int)((ulong)((long)(piVar2 + 1) -
                             (long)(local_80->row_offset).
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start) >> 2));
  local_c0.ptr_column = (pointer_index)CONCAT44(local_c0.ptr_column._4_4_,1);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_a0,"row.row()","1",(int *)&local_b0,(int *)&local_c0);
  if (local_a0.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_b0);
    if (local_98[0] == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = (local_98[0]->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse_new.cpp"
               ,0x154,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c0,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c0);
    if ((long *)local_b0.ptr_column != (long *)0x0) {
      (**(code **)(*(long *)local_b0.ptr_column + 8))();
    }
  }
  if (local_98[0] != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_98,local_98[0]);
  }
  plVar1 = (long *)((long)plVar8 + sVar9 * 4);
  local_c0.ptr_column = (pointer_index)plVar1;
  local_c0.ptr_entry = pdVar11 + sVar9;
  local_b0.ptr_column = (pointer_index)plVar8;
  local_b0.ptr_entry = pdVar11;
  testing::internal::
  CmpHelperEQ<Disa::Base_Iterator_Matrix_Sparse_Element<double,int,false>,Disa::Base_Iterator_Matrix_Sparse_Element<double,int,false>>
            ((internal *)&local_a0,"row.begin()","row.end()",&local_b0,&local_c0);
  if (local_a0.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_b0);
    if (local_98[0] == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = (local_98[0]->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse_new.cpp"
               ,0x155,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c0,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c0);
    if ((long *)local_b0.ptr_column != (long *)0x0) {
      (**(code **)(*(long *)local_b0.ptr_column + 8))();
    }
  }
  if (local_98[0] != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_98,local_98[0]);
  }
  local_c0.ptr_column = (pointer_index)plVar1;
  local_c0.ptr_entry = pdVar11 + sVar9;
  local_b0.ptr_column = (pointer_index)plVar8;
  local_b0.ptr_entry = pdVar11;
  testing::internal::
  CmpHelperEQ<Disa::Base_Iterator_Matrix_Sparse_Element<double,int,true>,Disa::Base_Iterator_Matrix_Sparse_Element<double,int,true>>
            ((internal *)&local_a0,"row.cbegin()","row.cend()",
             (Base_Iterator_Matrix_Sparse_Element<double,_int,_true> *)&local_b0,
             (Base_Iterator_Matrix_Sparse_Element<double,_int,_true> *)&local_c0);
  if (local_a0.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_b0);
    if (local_98[0] == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = (local_98[0]->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse_new.cpp"
               ,0x156,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c0,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c0);
    if ((long *)local_b0.ptr_column != (long *)0x0) {
      (**(code **)(*(long *)local_b0.ptr_column + 8))();
    }
  }
  if (local_98[0] != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_98,local_98[0]);
  }
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    local_b0.ptr_column = (pointer_index)0x147621;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)&local_a0,
               (testing *)&local_b0,regex);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_78,(PolymorphicMatcher *)&local_a0);
    if (local_98[0] != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98[0]);
    }
    bVar4 = testing::internal::DeathTest::Create
                      ("remove_warning = row.at(0)",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_78,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse_new.cpp"
                       ,0x158,(DeathTest **)&local_c0);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_78);
    plVar8 = (long *)local_c0.ptr_column;
    if (bVar4) {
      if ((long *)local_c0.ptr_column == (long *)0x0) {
        return;
      }
      iVar6 = (**(code **)(*(long *)local_c0.ptr_column + 0x10))(local_c0.ptr_column);
      piVar3 = local_c0.ptr_column;
      if (iVar6 == 0) {
        iVar6 = (**(code **)(*(long *)local_c0.ptr_column + 0x18))(local_c0.ptr_column);
        bVar4 = testing::internal::ExitedUnsuccessfully(iVar6);
        cVar5 = (**(code **)(*(long *)piVar3 + 0x20))(piVar3,bVar4);
        if (cVar5 == '\0') {
          (**(code **)(*plVar8 + 8))(plVar8);
          goto LAB_00112cf8;
        }
      }
      else if (iVar6 == 1) {
        bVar4 = testing::internal::AlwaysTrue();
        if (bVar4) {
          local_a0.ss_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._0_4_ = 0;
          Disa::Matrix_Sparse_Row<double,_int>::at(&local_60,(index_type *)&local_a0);
        }
        (**(code **)(*(long *)local_c0.ptr_column + 0x28))(local_c0.ptr_column,2);
        (**(code **)(*(long *)piVar3 + 0x28))(piVar3,0);
      }
      lVar10 = *plVar8;
      goto LAB_00112d4b;
    }
  }
LAB_00112cf8:
  testing::Message::Message(&local_a0);
  pcVar7 = testing::internal::DeathTest::LastMessage();
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_b0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse_new.cpp"
             ,0x158,pcVar7);
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_b0,&local_a0);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
  plVar8 = (long *)CONCAT44(local_a0.ss_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl._4_4_,
                            local_a0.ss_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl._0_4_);
  if (plVar8 == (long *)0x0) {
    return;
  }
  lVar10 = *plVar8;
LAB_00112d4b:
  (**(code **)(lVar10 + 8))(plVar8);
  return;
}

Assistant:

TEST_F(matrix_sparse_row_test, empty_row) {
  Matrix_Sparse_Row<double, int> row(&csr_data, csr_data.row_offset.begin() + 1);

  EXPECT_EQ(row.row_offset(), 2);
  EXPECT_EQ(row.size_non_zero(), 0);
  EXPECT_EQ(row.row(), 1);
  EXPECT_EQ(row.begin(), row.end());
  EXPECT_EQ(row.cbegin(), row.cend());
  double remove_warning = 0;
  EXPECT_DEATH(remove_warning = row.at(0), ".*");
}